

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O1

void message_tick(t_message *x)

{
  int iVar1;
  _rtext *x_00;
  char *pcVar2;
  undefined4 extraout_var;
  _glist *p_Var3;
  char buf [1000];
  char local_408 [1008];
  
  iVar1 = glist_isvisible(x->m_glist);
  if (iVar1 != 0) {
    x_00 = glist_findrtext(x->m_glist,&x->m_text);
    pcVar2 = rtext_gettag(x_00);
    iVar1 = sprintf(local_408,"%sR",pcVar2);
    p_Var3 = glist_getcanvas((_glist *)CONCAT44(extraout_var,iVar1));
    iVar1 = glist_getzoom(x->m_glist);
    pdgui_vmess((char *)0x0,"crs ri",p_Var3,"itemconfigure",local_408,"-width",iVar1);
  }
  return;
}

Assistant:

static void message_tick(t_message *x)
{
    if (glist_isvisible(x->m_glist))
    {
        t_rtext *y = glist_findrtext(x->m_glist, &x->m_text);
        char buf[MAXPDSTRING];
        sprintf(buf, "%sR", rtext_gettag(y));
        pdgui_vmess(0, "crs ri",
            glist_getcanvas(x->m_glist),
            "itemconfigure",
            buf,
            "-width", glist_getzoom(x->m_glist));
    }
}